

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int mbedtls_dhm_parse_dhmfile(mbedtls_dhm_context *dhm,char *path)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  size_t __n;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  size_t unaff_R14;
  uchar *unaff_R15;
  
  __stream = fopen(path,"rb");
  iVar2 = -0x3480;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    if (__n != 0xffffffffffffffff) {
      fseek(__stream,0,0);
      unaff_R15 = (uchar *)calloc(1,__n + 1);
      if (unaff_R15 == (uchar *)0x0) {
        fclose(__stream);
        iVar2 = -0x3400;
        bVar1 = false;
      }
      else {
        sVar3 = fread(unaff_R15,1,__n,__stream);
        fclose(__stream);
        if (sVar3 == __n) {
          unaff_R15[__n] = '\0';
          pcVar4 = strstr((char *)unaff_R15,"-----BEGIN ");
          if (pcVar4 != (char *)0x0) {
            __n = __n + 1;
          }
          iVar2 = 0;
          bVar1 = true;
        }
        else {
          free(unaff_R15);
          bVar1 = false;
        }
      }
      goto LAB_001535c4;
    }
    fclose(__stream);
  }
  bVar1 = false;
  __n = unaff_R14;
LAB_001535c4:
  if (bVar1) {
    iVar2 = mbedtls_dhm_parse_dhm(dhm,unaff_R15,__n);
    if (__n != 0) {
      sVar5 = 0;
      do {
        unaff_R15[sVar5] = '\0';
        sVar5 = sVar5 + 1;
      } while (__n != sVar5);
    }
    free(unaff_R15);
  }
  return iVar2;
}

Assistant:

int mbedtls_dhm_parse_dhmfile( mbedtls_dhm_context *dhm, const char *path )
{
    int ret;
    size_t n;
    unsigned char *buf;

    if( ( ret = load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    ret = mbedtls_dhm_parse_dhm( dhm, buf, n );

    mbedtls_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}